

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

GraphId __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::GetId(GraphCycles *this,void *ptr)

{
  Rep *pRVar1;
  Node **ppNVar2;
  uint uVar3;
  uint32_t uVar4;
  GraphId GVar5;
  Node *pNVar6;
  uint uVar7;
  ulong uVar8;
  
  pRVar1 = this->rep_;
  uVar8 = (ulong)ptr % 0x3fffb;
  uVar7 = (pRVar1->ptrmap_).table_._M_elems[uVar8];
  if (uVar7 != 0xffffffff) {
    do {
      pNVar6 = ((pRVar1->ptrmap_).nodes_)->ptr_[uVar7];
      if ((pNVar6->masked_ptr ^ (ulong)ptr) == 0xf03a5f7bf03a5f7b) {
        return (GraphId)CONCAT44((pRVar1->nodes_).ptr_[uVar7]->version,uVar7);
      }
      uVar7 = pNVar6->next_hash;
    } while (uVar7 != 0xffffffff);
  }
  uVar4 = (pRVar1->free_nodes_).size_;
  if (uVar4 == 0) {
    pNVar6 = (Node *)base_internal::LowLevelAlloc::AllocWithArena
                               (0x1d0,(anonymous_namespace)::arena);
    anon_unknown_0::NodeSet::NodeSet(&pNVar6->in);
    anon_unknown_0::NodeSet::NodeSet(&pNVar6->out);
    pNVar6->version = 1;
    pNVar6->visited = false;
    pRVar1 = this->rep_;
    uVar7 = (pRVar1->nodes_).size_;
    pNVar6->rank = uVar7;
    pNVar6->masked_ptr = (ulong)ptr ^ 0xf03a5f7bf03a5f7b;
    pNVar6->priority = 0;
    pNVar6->nstack = 0;
    uVar4 = uVar7;
    if (uVar7 == (pRVar1->nodes_).capacity_) {
      anon_unknown_0::
      Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>::Grow
                (&pRVar1->nodes_,uVar7 + 1);
      uVar7 = pNVar6->rank;
      uVar4 = (pRVar1->nodes_).size_;
    }
    (pRVar1->nodes_).ptr_[uVar4] = pNVar6;
    (pRVar1->nodes_).size_ = uVar4 + 1;
    pRVar1 = this->rep_;
    ((pRVar1->ptrmap_).nodes_)->ptr_[uVar7]->next_hash = (pRVar1->ptrmap_).table_._M_elems[uVar8];
    (pRVar1->ptrmap_).table_._M_elems[uVar8] = uVar7;
    GVar5.handle._0_4_ = pNVar6->rank;
    GVar5.handle._4_4_ = pNVar6->version;
  }
  else {
    ppNVar2 = (pRVar1->nodes_).ptr_;
    uVar3 = uVar4 - 1;
    uVar7 = (pRVar1->free_nodes_).ptr_[uVar3];
    (pRVar1->free_nodes_).size_ = uVar3;
    pNVar6 = ppNVar2[uVar7];
    pNVar6->masked_ptr = (ulong)ptr ^ 0xf03a5f7bf03a5f7b;
    pNVar6->priority = 0;
    pNVar6->nstack = 0;
    ((pRVar1->ptrmap_).nodes_)->ptr_[uVar7]->next_hash = (pRVar1->ptrmap_).table_._M_elems[uVar8];
    (pRVar1->ptrmap_).table_._M_elems[uVar8] = uVar7;
    GVar5.handle = CONCAT44(pNVar6->version,uVar7);
  }
  return (GraphId)GVar5.handle;
}

Assistant:

GraphId GraphCycles::GetId(void* ptr) {
  int32_t i = rep_->ptrmap_.Find(ptr);
  if (i != -1) {
    return MakeId(i, rep_->nodes_[static_cast<uint32_t>(i)]->version);
  } else if (rep_->free_nodes_.empty()) {
    Node* n =
        new (base_internal::LowLevelAlloc::AllocWithArena(sizeof(Node), arena))
            Node;
    n->version = 1;  // Avoid 0 since it is used by InvalidGraphId()
    n->visited = false;
    n->rank = static_cast<int32_t>(rep_->nodes_.size());
    n->masked_ptr = base_internal::HidePtr(ptr);
    n->nstack = 0;
    n->priority = 0;
    rep_->nodes_.push_back(n);
    rep_->ptrmap_.Add(ptr, n->rank);
    return MakeId(n->rank, n->version);
  } else {
    // Preserve preceding rank since the set of ranks in use must be
    // a permutation of [0,rep_->nodes_.size()-1].
    int32_t r = rep_->free_nodes_.back();
    rep_->free_nodes_.pop_back();
    Node* n = rep_->nodes_[static_cast<uint32_t>(r)];
    n->masked_ptr = base_internal::HidePtr(ptr);
    n->nstack = 0;
    n->priority = 0;
    rep_->ptrmap_.Add(ptr, r);
    return MakeId(r, n->version);
  }
}